

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::getPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  long lVar1;
  double *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar2;
  int i_1;
  double scaleFactor;
  int k;
  int index;
  double *cumulativeScaleBuffer;
  int i;
  int l_1;
  double *offsetBeaglePartials_1;
  double *offsetOutPartials_1;
  int l;
  double *offsetBeaglePartials;
  double *offsetOutPartials;
  int local_6c;
  int local_60;
  int local_5c;
  int local_50;
  int local_4c;
  double *local_48;
  double *local_40;
  int local_34;
  double *local_30;
  double *local_28;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    if ((*(int *)(in_RDI + 0x14) == *(int *)(in_RDI + 0x18)) &&
       (*(int *)(in_RDI + 0x24) == *(int *)(in_RDI + 0x2c))) {
      beagleMemCpy<double,double>
                (in_RCX,*(double **)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8),
                 *(uint *)(in_RDI + 0x3c));
    }
    else if (*(int *)(in_RDI + 0x24) == *(int *)(in_RDI + 0x2c)) {
      local_30 = *(double **)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
      local_28 = in_RCX;
      for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
        beagleMemCpy<double,double>
                  (local_28,local_30,*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24));
        local_28 = local_28 + *(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24);
        local_30 = local_30 + *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x24);
      }
    }
    else {
      local_48 = *(double **)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
      local_40 = in_RCX;
      for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x34); local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x14); local_50 = local_50 + 1) {
          beagleMemCpy<double,double>(local_40,local_48,*(uint *)(in_RDI + 0x24));
          local_40 = local_40 + *(int *)(in_RDI + 0x24);
          local_48 = local_48 + *(int *)(in_RDI + 0x2c);
        }
        local_48 = local_48 +
                   (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x14)) * *(int *)(in_RDI + 0x2c);
      }
    }
    if (in_EDX != -1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_EDX * 8);
      local_5c = 0;
      for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x14); local_60 = local_60 + 1) {
        dVar2 = exp(*(double *)(lVar1 + (long)local_60 * 8));
        for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x24); local_6c = local_6c + 1) {
          in_RCX[local_5c] = dVar2 * in_RCX[local_5c];
          local_5c = local_5c + 1;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}